

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::ssbo_block_matching
               (NegativeTestContext *ctx)

{
  SsboArgData *pSVar1;
  ulong uVar2;
  bool bVar3;
  ContextType ctxType;
  ApiType requiredApiType;
  GLuint program_00;
  RenderContext *pRVar4;
  SsboArgs *args;
  char *__s;
  MessageBuilder *pMVar5;
  size_type sVar6;
  reference pvVar7;
  TestLog *in_R8;
  TestLog *log_00;
  SsboArgData *local_998;
  allocator<char> local_879;
  string local_878;
  MessageBuilder local_858;
  string local_6d8;
  SsboArgData local_6b8;
  allocator<char> local_689;
  string local_688;
  GLchar *local_668;
  char *shaderFragmentCharPtr;
  string shaderFragmentString;
  GLint shaderFragmentGL;
  GLint program;
  GLint linkStatus;
  size_t idx;
  string local_4a8;
  allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
  local_481;
  undefined1 local_480 [8];
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorFrag;
  string local_460;
  ArgMember local_440;
  allocator<char> local_439;
  string local_438;
  ArgMember local_418;
  allocator<char> local_411;
  string local_410;
  ArgMember local_3f0;
  allocator<char> local_3e9;
  string local_3e8;
  ArgMember local_3c8;
  allocator<char> local_3c1;
  string local_3c0;
  ArgMember local_3a0;
  allocator<char> local_399;
  string local_398;
  ArgMember local_378;
  allocator<char> local_371;
  string local_370;
  ArgMember local_350;
  allocator<char> local_349;
  string local_348;
  ArgMember local_324;
  SsboArgData *local_320;
  undefined1 local_318 [8];
  SsboArgData argDataArrayFrag [8];
  char *shaderVertexCharPtr;
  string shaderVertexString;
  undefined1 local_1a8 [4];
  GLint shaderVertexGL;
  undefined1 local_188 [8];
  SsboArgs ssboArgs;
  string local_68 [8];
  string versionString;
  string message;
  TestLog *log;
  GLSLVersion version;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  pRVar4 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar3 = glu::contextSupports(ctxType,requiredApiType);
  args = (SsboArgs *)glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  std::__cxx11::string::string((string *)(versionString.field_2._M_local_buf + 8));
  __s = glu::getGLSLVersionDeclaration(bVar3 | GLSL_VERSION_310_ES);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,__s,(allocator<char> *)((long)&ssboArgs.m_testLog + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&ssboArgs.m_testLog + 3));
  std::__cxx11::string::string((string *)local_1a8,local_68);
  anon_unknown_0::args::SsboArgs::SsboArgs
            ((SsboArgs *)local_188,(string *)local_1a8,(TestLog *)args);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string((string *)&shaderVertexCharPtr);
  argDataVectorFrag.
  super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_320 = (SsboArgData *)local_318;
  local_324 = ARGMEMBER_FORMAT;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"std140",&local_349);
  anon_unknown_0::args::SsboArgData::SsboArgData((SsboArgData *)local_318,&local_324,&local_348);
  pSVar1 = (SsboArgData *)((long)&argDataArrayFrag[0].data.field_2 + 8);
  local_350 = ARGMEMBER_BINDING_POINT;
  local_320 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"10",&local_371);
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_350,&local_370);
  pSVar1 = (SsboArgData *)((long)&argDataArrayFrag[1].data.field_2 + 8);
  local_378 = ARGMEMBER_MATRIX_ORDER;
  local_320 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"row_major",&local_399);
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_378,&local_398);
  pSVar1 = (SsboArgData *)((long)&argDataArrayFrag[2].data.field_2 + 8);
  local_3a0 = ARGMEMBER_MEMBER_TYPE;
  local_320 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"vec2",&local_3c1);
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_3a0,&local_3c0);
  pSVar1 = (SsboArgData *)((long)&argDataArrayFrag[3].data.field_2 + 8);
  local_3c8 = ARGMEMBER_NAME;
  local_320 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"name_changed",&local_3e9)
  ;
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_3c8,&local_3e8);
  pSVar1 = (SsboArgData *)((long)&argDataArrayFrag[4].data.field_2 + 8);
  local_3f0 = ARGMEMBER_FIXED_ARRAY;
  local_320 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"20",&local_411);
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_3f0,&local_410);
  pSVar1 = (SsboArgData *)((long)&argDataArrayFrag[5].data.field_2 + 8);
  local_418 = ARGMEMBER_VARIABLE_ARRAY;
  local_320 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"5",&local_439);
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_418,&local_438);
  pSVar1 = (SsboArgData *)((long)&argDataArrayFrag[6].data.field_2 + 8);
  local_440 = ARGMEMBER_REORDER;
  local_320 = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"true",
             (allocator<char> *)
             ((long)&argDataVectorFrag.
                     super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  anon_unknown_0::args::SsboArgData::SsboArgData(pSVar1,&local_440,&local_460);
  argDataVectorFrag.
  super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&argDataVectorFrag.
                     super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::
  allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
  ::allocator(&local_481);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)local_480,(SsboArgData *)local_318,
             (SsboArgData *)((long)&argDataArrayFrag[7].data.field_2 + 8),&local_481);
  std::
  allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>
  ::~allocator(&local_481);
  (anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
            (&local_4a8,(_anonymous_namespace_ *)0x8b31,(GLenum)local_188,args,in_R8);
  std::__cxx11::string::operator=((string *)&shaderVertexCharPtr,(string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  argDataArrayFrag[7].data.field_2._8_8_ = std::__cxx11::string::c_str();
  shaderVertexString.field_2._12_4_ =
       glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  std::__cxx11::string::operator=
            ((string *)(versionString.field_2._M_local_buf + 8),(string *)&shaderVertexCharPtr);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&idx,(TestLog *)args,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&idx,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&versionString.field_2 + 8));
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&idx);
  log_00 = (TestLog *)0x0;
  glu::CallLogWrapper::glShaderSource
            (&ctx->super_CallLogWrapper,shaderVertexString.field_2._12_4_,1,
             (GLchar **)((long)&argDataArrayFrag[7].data.field_2 + 8),(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shaderVertexString.field_2._12_4_)
  ;
  _program = 0;
  while( true ) {
    uVar2 = _program;
    sVar6 = std::
            vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
            ::size((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                    *)local_480);
    if (sVar6 <= uVar2) break;
    shaderFragmentGL = -1;
    std::__cxx11::string::string((string *)&shaderFragmentCharPtr);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_688,
               "Multiple shaders created using SSBO\'s sharing the same name but not matching layouts"
               ,&local_689);
    NegativeTestContext::beginSection(ctx,&local_688);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator(&local_689);
    program_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
    anon_unknown_0::args::SsboArgs::resetValues((SsboArgs *)local_188);
    pvVar7 = std::
             vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             ::operator[]((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                           *)local_480,_program);
    anon_unknown_0::args::SsboArgData::SsboArgData(&local_6b8,pvVar7);
    anon_unknown_0::args::SsboArgs::setSingleValue((SsboArgs *)local_188,&local_6b8);
    anon_unknown_0::args::SsboArgData::~SsboArgData(&local_6b8);
    (anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
              (&local_6d8,(_anonymous_namespace_ *)0x8b30,(GLenum)local_188,args,log_00);
    std::__cxx11::string::operator=((string *)&shaderFragmentCharPtr,(string *)&local_6d8);
    std::__cxx11::string::~string((string *)&local_6d8);
    local_668 = (GLchar *)std::__cxx11::string::c_str();
    shaderFragmentString.field_2._12_4_ =
         glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
    std::__cxx11::string::operator=
              ((string *)(versionString.field_2._M_local_buf + 8),(string *)&shaderFragmentCharPtr);
    tcu::TestLog::operator<<(&local_858,(TestLog *)args,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_858,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&versionString.field_2 + 8));
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_858);
    log_00 = (TestLog *)0x0;
    glu::CallLogWrapper::glShaderSource
              (&ctx->super_CallLogWrapper,shaderFragmentString.field_2._12_4_,1,&local_668,
               (GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&ctx->super_CallLogWrapper,shaderFragmentString.field_2._12_4_);
    glu::CallLogWrapper::glAttachShader
              (&ctx->super_CallLogWrapper,program_00,shaderVertexString.field_2._12_4_);
    glu::CallLogWrapper::glAttachShader
              (&ctx->super_CallLogWrapper,program_00,shaderFragmentString.field_2._12_4_);
    glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program_00);
    glu::CallLogWrapper::glGetProgramiv
              (&ctx->super_CallLogWrapper,program_00,0x8b82,&shaderFragmentGL);
    logProgramInfo(ctx,program_00);
    if (shaderFragmentGL == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_878,"Program should not have linked",&local_879);
      NegativeTestContext::fail(ctx,&local_878);
      std::__cxx11::string::~string((string *)&local_878);
      std::allocator<char>::~allocator(&local_879);
    }
    glu::CallLogWrapper::glDeleteShader
              (&ctx->super_CallLogWrapper,shaderFragmentString.field_2._12_4_);
    glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_00);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::~string((string *)&shaderFragmentCharPtr);
    _program = _program + 1;
  }
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shaderVertexString.field_2._12_4_);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             *)local_480);
  local_998 = (SsboArgData *)((long)&argDataArrayFrag[7].data.field_2 + 8);
  do {
    local_998 = local_998 + -1;
    anon_unknown_0::args::SsboArgData::~SsboArgData(local_998);
  } while (local_998 != (SsboArgData *)local_318);
  std::__cxx11::string::~string((string *)&shaderVertexCharPtr);
  anon_unknown_0::args::SsboArgs::~SsboArgs((SsboArgs *)local_188);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)(versionString.field_2._M_local_buf + 8));
  return;
}

Assistant:

void ssbo_block_matching(NegativeTestContext& ctx)
{
	const bool				isES32													=	contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version													=	isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	tcu::TestLog&			log														=	ctx.getLog();
	std::string				message;
	std::string				versionString(glu::getGLSLVersionDeclaration(version));
	args::SsboArgs			ssboArgs(versionString, log);
	GLint					shaderVertexGL;
	std::string				shaderVertexString;
	const char*				shaderVertexCharPtr;

	// List of arguments used to create varying ssbo objects in the fragment shader
	const args::SsboArgData argDataArrayFrag[] = {	args::SsboArgData(args::ARGMEMBER_FORMAT,			"std140"),
													args::SsboArgData(args::ARGMEMBER_BINDING_POINT,	"10"),
													args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"row_major"),
													args::SsboArgData(args::ARGMEMBER_MEMBER_TYPE,		"vec2"),
													args::SsboArgData(args::ARGMEMBER_NAME,				"name_changed"),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"20"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	"5"),
													args::SsboArgData(args::ARGMEMBER_REORDER,			"true") };
	std::vector<args::SsboArgData> argDataVectorFrag(argDataArrayFrag, argDataArrayFrag + sizeof(argDataArrayFrag) / sizeof(argDataArrayFrag[0]));

	// create default vertex shader
	shaderVertexString = generateVaryingSSBOShader(GL_VERTEX_SHADER, ssboArgs, log);
	shaderVertexCharPtr = shaderVertexString.c_str();
	shaderVertexGL = ctx.glCreateShader(GL_VERTEX_SHADER);

	// log
	message = shaderVertexString;
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	// compile
	ctx.glShaderSource(shaderVertexGL, 1, &shaderVertexCharPtr, DE_NULL);
	ctx.glCompileShader(shaderVertexGL);

	for (std::size_t idx = 0; idx < argDataVectorFrag.size(); ++idx)
	{
		GLint			linkStatus				=	-1;
		GLint			program;
		GLint			shaderFragmentGL;
		std::string		shaderFragmentString;
		const char*		shaderFragmentCharPtr;

		ctx.beginSection("Multiple shaders created using SSBO's sharing the same name but not matching layouts");

		program = ctx.glCreateProgram();

		// reset args to default and make a single change
		ssboArgs.resetValues();
		ssboArgs.setSingleValue(argDataVectorFrag[idx]);

		// create fragment shader
		shaderFragmentString = generateVaryingSSBOShader(GL_FRAGMENT_SHADER, ssboArgs, log);
		shaderFragmentCharPtr = shaderFragmentString.c_str();
		shaderFragmentGL = ctx.glCreateShader(GL_FRAGMENT_SHADER);

		// log
		message = shaderFragmentString;
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

		// compile
		ctx.glShaderSource(shaderFragmentGL, 1, &shaderFragmentCharPtr, DE_NULL);
		ctx.glCompileShader(shaderFragmentGL);

		// attach shaders to program and attempt to link
		ctx.glAttachShader(program, shaderVertexGL);
		ctx.glAttachShader(program, shaderFragmentGL);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);

		logProgramInfo(ctx, program);

		if (linkStatus == GL_TRUE)
		{
			ctx.fail("Program should not have linked");
		}

		// clean up resources
		ctx.glDeleteShader(shaderFragmentGL);
		ctx.glDeleteProgram(program);

		ctx.endSection();
	}

	// clean up default resources
	ctx.glDeleteShader(shaderVertexGL);
}